

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  thread_specific_ptr<tls_object> *ptVar2;
  runtime_error *prVar3;
  exception *e;
  ostringstream oss_29;
  ostringstream oss_28;
  thread t2_10;
  thread t1_10;
  rw_unique_thread t2c;
  rw_shared_thread t1c;
  bool write;
  bool read;
  recursive_shared_mutex l_2;
  ostringstream oss_27;
  ostringstream oss_26;
  ostringstream oss_25;
  unique_lock<std::mutex> l_1;
  int i_1;
  thread t3_5;
  thread t2_9;
  thread t1_9;
  rw_executor<booster::recursive_shared_mutex> exec3_1;
  rw_executor<booster::recursive_shared_mutex> exec2_1;
  rw_executor<booster::recursive_shared_mutex> exec1_1;
  bool error_occured_1;
  bool write_happened_1;
  bool mread_happened_1;
  bool flags_1 [3];
  recursive_shared_mutex sm_1;
  mutex fm_1;
  ostringstream oss_24;
  ostringstream oss_23;
  ostringstream oss_22;
  unique_lock<std::mutex> l;
  int i;
  thread t3_4;
  thread t2_8;
  thread t1_8;
  rw_executor<booster::shared_mutex> exec3;
  rw_executor<booster::shared_mutex> exec2;
  rw_executor<booster::shared_mutex> exec1;
  bool error_occured;
  bool write_happened;
  bool mread_happened;
  bool flags [3];
  shared_mutex sm;
  mutex fm;
  ostringstream oss_21;
  thread t2_7;
  thread t1_7;
  incrementer<booster::shared_mutex> inc_5;
  shared_mutex m_6;
  ostringstream oss_20;
  thread t2_6;
  thread t1_6;
  incrementer<booster::shared_mutex> inc_4;
  shared_mutex m_5;
  ostringstream oss_19;
  ostringstream oss_18;
  thread t3_3;
  thread t2_5;
  thread t1_5;
  cond_incrementer inc_3;
  condition_variable c_1;
  mutex m_4;
  int counter_1 [3];
  ostringstream oss_17;
  ostringstream oss_16;
  ostringstream oss_15;
  ostringstream oss_14;
  thread t3_2;
  thread t2_4;
  thread t1_4;
  cond_incrementer inc_2;
  condition_variable c;
  mutex m_3;
  int counter;
  ostringstream oss_13;
  thread t3_1;
  thread t2_3;
  thread t1_3;
  tls_functor2 f3_1;
  tls_functor2 f2_1;
  tls_functor2 f1_1;
  thread_specific_ptr<tls_object> *p_1;
  ostringstream oss_12;
  ostringstream oss_11;
  thread t3;
  thread t2_2;
  thread t1_2;
  tls_functor f3;
  tls_functor f2;
  tls_functor f1;
  thread_specific_ptr<tls_object> p;
  ostringstream oss_10;
  thread t2_1;
  thread t1_1;
  incrementer<std::mutex> inc_1;
  mutex m_2;
  ostringstream oss_9;
  thread t2;
  thread t1;
  incrementer<std::recursive_mutex> inc;
  recursive_mutex m_1;
  recursive_mutex m;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  thread t_2;
  counted_functor f_1;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  thread t_1;
  counted_functor f;
  ostringstream oss_2;
  ostringstream oss_1;
  thread t;
  ostringstream oss;
  mutex_type *in_stack_ffffffffffffc268;
  unique_lock<std::mutex> *in_stack_ffffffffffffc270;
  longlong in_stack_ffffffffffffc280;
  rw_executor<booster::recursive_shared_mutex> *in_stack_ffffffffffffc298;
  thread *in_stack_ffffffffffffc2a0;
  string local_3818 [32];
  ostringstream local_37f8 [383];
  undefined1 local_3679;
  string local_3678 [32];
  ostringstream local_3658 [392];
  recursive_shared_mutex *local_34d0;
  byte *local_34c8;
  recursive_shared_mutex *local_34c0;
  byte *local_34b8;
  byte local_34aa;
  byte local_34a9;
  recursive_shared_mutex local_34a8 [15];
  undefined1 local_3499;
  string local_3498 [32];
  ostringstream local_3478 [383];
  undefined1 local_32f9;
  string local_32f8 [32];
  ostringstream local_32d8 [383];
  undefined1 local_3159;
  string local_3158 [32];
  ostringstream local_3138 [396];
  int local_2fac;
  byte *local_2f90;
  undefined1 local_2f88;
  undefined1 *local_2f80;
  recursive_shared_mutex *local_2f78;
  long local_2f70;
  undefined1 local_2f68;
  undefined1 *local_2f60;
  recursive_shared_mutex *local_2f58;
  undefined2 *local_2f50;
  undefined1 local_2f48;
  undefined1 *local_2f40;
  recursive_shared_mutex *local_2f38;
  byte local_2f2f;
  byte local_2f2e;
  byte local_2f2d;
  undefined2 local_2f2c;
  byte local_2f2a [2];
  recursive_shared_mutex local_2f28 [8];
  undefined1 local_2f20 [47];
  undefined1 local_2ef1;
  string local_2ef0 [32];
  ostringstream local_2ed0 [383];
  undefined1 local_2d51;
  string local_2d50 [32];
  ostringstream local_2d30 [383];
  undefined1 local_2bb1;
  string local_2bb0 [32];
  ostringstream local_2b90 [396];
  int local_2a04;
  byte *local_29e8;
  undefined1 local_29e0;
  undefined1 *local_29d8;
  shared_mutex *local_29d0;
  long local_29c8;
  undefined1 local_29c0;
  undefined1 *local_29b8;
  shared_mutex *local_29b0;
  undefined2 *local_29a8;
  undefined1 local_29a0;
  undefined1 *local_2998;
  shared_mutex *local_2990;
  byte local_2987;
  byte local_2986;
  byte local_2985;
  undefined2 local_2984;
  byte local_2982 [2];
  shared_mutex local_2980 [8];
  undefined1 local_2978 [47];
  undefined1 local_2949;
  string local_2948 [32];
  ostringstream local_2928 [392];
  shared_mutex *local_27a0;
  shared_mutex local_2798 [15];
  undefined1 local_2789;
  string local_2788 [32];
  ostringstream local_2768 [392];
  shared_mutex *local_25e0;
  shared_mutex local_25d8 [15];
  undefined1 local_25c9;
  string local_25c8 [32];
  ostringstream local_25a8 [383];
  undefined1 local_2429;
  string local_2428 [32];
  ostringstream local_2408 [400];
  undefined8 *local_2278;
  undefined1 *local_2270;
  condition_variable *local_2268;
  condition_variable local_2260 [48];
  undefined1 local_2230 [40];
  undefined8 local_2208;
  int local_2200;
  undefined1 local_21f9;
  string local_21f8 [32];
  ostringstream local_21d8 [383];
  undefined1 local_2059;
  string local_2058 [32];
  ostringstream local_2038 [383];
  undefined1 local_1eb9;
  string local_1eb8 [32];
  ostringstream local_1e98 [383];
  undefined1 local_1d19;
  string local_1d18 [32];
  ostringstream local_1cf8 [400];
  int *local_1b68;
  undefined1 *local_1b60;
  condition_variable *local_1b58;
  condition_variable local_1b50 [48];
  undefined1 local_1b20 [40];
  int local_1af8;
  undefined1 local_1af1;
  string local_1af0 [32];
  ostringstream local_1ad0 [400];
  tls_functor2 local_1940;
  tls_functor2 local_1938;
  tls_functor2 local_1930;
  thread_specific_ptr<tls_object> *local_1928;
  undefined1 local_1919;
  string local_1918 [32];
  ostringstream local_18f8 [383];
  undefined1 local_1779;
  string local_1778 [32];
  ostringstream local_1758 [400];
  tls_functor local_15c8;
  tls_functor local_15c0;
  tls_functor local_15b8;
  thread_specific_ptr<tls_object> local_15b0;
  undefined1 local_15a1;
  string local_15a0 [32];
  ostringstream local_1580 [392];
  undefined1 *local_13f8;
  undefined1 local_13f0 [47];
  undefined1 local_13c1;
  string local_13c0 [32];
  ostringstream local_13a0 [392];
  undefined1 *local_1218;
  undefined1 local_1210 [839];
  undefined1 local_ec9;
  string local_ec8 [32];
  ostringstream local_ea8 [383];
  undefined1 local_d29;
  string local_d28 [32];
  ostringstream local_d08 [383];
  undefined1 local_b89;
  string local_b88 [32];
  ostringstream local_b68 [391];
  undefined1 local_9e1;
  string local_9e0 [32];
  ostringstream local_9c0 [383];
  undefined1 local_841;
  string local_840 [32];
  ostringstream local_820 [383];
  undefined1 local_6a1;
  string local_6a0 [32];
  ostringstream local_680 [391];
  undefined1 local_4f9;
  string local_4f8 [32];
  ostringstream local_4d8 [383];
  undefined1 local_359;
  string local_358 [32];
  ostringstream local_338 [391];
  undefined1 local_1b1;
  string local_1b0 [32];
  ostringstream local_190 [396];
  undefined4 local_4;
  
  local_4 = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Test execution");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((called_ & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xcb);
    std::operator<<(poVar1," !called_");
    local_1b1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    local_1b1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::thread<void(&)(),,void>
            (in_stack_ffffffffffffc2a0,(_func_void *)in_stack_ffffffffffffc298);
  std::thread::join();
  if ((called_ & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_338);
    poVar1 = std::operator<<((ostream *)local_338,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xce);
    std::operator<<(poVar1," called_");
    local_359 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_358);
    local_359 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread((thread *)0x10b830);
  poVar1 = std::operator<<((ostream *)&std::cout,"Functor destruction");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (counted_functor::objects != 0) {
    std::__cxx11::ostringstream::ostringstream(local_4d8);
    poVar1 = std::operator<<((ostream *)local_4d8,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd2);
    std::operator<<(poVar1," counted_functor::objects==0");
    local_4f9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_4f8);
    local_4f9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  counted_functor::counted_functor((counted_functor *)0x10ba17);
  std::thread::thread<counted_functor&,,void>
            (in_stack_ffffffffffffc2a0,(counted_functor *)in_stack_ffffffffffffc298);
  if (counted_functor::objects < 2) {
    std::__cxx11::ostringstream::ostringstream(local_680);
    poVar1 = std::operator<<((ostream *)local_680,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd6);
    std::operator<<(poVar1," counted_functor::objects>=2");
    local_6a1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_6a0);
    local_6a1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::join();
  if (counted_functor::objects != 1) {
    std::__cxx11::ostringstream::ostringstream(local_820);
    poVar1 = std::operator<<((ostream *)local_820,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd8);
    std::operator<<(poVar1," counted_functor::objects==1");
    local_841 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_840);
    local_841 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread((thread *)0x10bda5);
  counted_functor::~counted_functor((counted_functor *)0x10bdb2);
  if (counted_functor::objects != 0) {
    std::__cxx11::ostringstream::ostringstream(local_9c0);
    poVar1 = std::operator<<((ostream *)local_9c0,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xda);
    std::operator<<(poVar1," counted_functor::objects==0");
    local_9e1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_9e0);
    local_9e1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  counted_functor::counted_functor((counted_functor *)0x10bf71);
  std::thread::thread<counted_functor&,,void>
            (in_stack_ffffffffffffc2a0,(counted_functor *)in_stack_ffffffffffffc298);
  if (counted_functor::objects < 2) {
    std::__cxx11::ostringstream::ostringstream(local_b68);
    poVar1 = std::operator<<((ostream *)local_b68,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xdf);
    std::operator<<(poVar1," counted_functor::objects>=2");
    local_b89 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_b88);
    local_b89 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::detach();
  std::thread::~thread((thread *)0x10c16a);
  counted_functor::~counted_functor((counted_functor *)0x10c177);
  if (counted_functor::objects < 1) {
    std::__cxx11::ostringstream::ostringstream(local_d08);
    poVar1 = std::operator<<((ostream *)local_d08,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xe2);
    std::operator<<(poVar1," counted_functor::objects>=1");
    local_d29 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_d28);
    local_d29 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::millisleep(in_stack_ffffffffffffc280);
  if (counted_functor::objects != 0) {
    std::__cxx11::ostringstream::ostringstream(local_ea8);
    poVar1 = std::operator<<((ostream *)local_ea8,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xe4);
    std::operator<<(poVar1," counted_functor::objects==0");
    local_ec9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_ec8);
    local_ec9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Test recursive mutex");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x10c512);
  std::recursive_mutex::lock((recursive_mutex *)in_stack_ffffffffffffc270);
  std::recursive_mutex::lock((recursive_mutex *)in_stack_ffffffffffffc270);
  std::recursive_mutex::unlock((recursive_mutex *)0x10c541);
  std::recursive_mutex::unlock((recursive_mutex *)0x10c550);
  variable = 0;
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x10c575);
  local_1218 = local_1210;
  std::thread::thread<incrementer<std::recursive_mutex>&,,void>
            (in_stack_ffffffffffffc2a0,
             (incrementer<std::recursive_mutex> *)in_stack_ffffffffffffc298);
  std::thread::thread<incrementer<std::recursive_mutex>&,,void>
            (in_stack_ffffffffffffc2a0,
             (incrementer<std::recursive_mutex> *)in_stack_ffffffffffffc298);
  std::thread::join();
  std::thread::join();
  if (variable != 10) {
    std::__cxx11::ostringstream::ostringstream(local_13a0);
    poVar1 = std::operator<<((ostream *)local_13a0,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xfa);
    std::operator<<(poVar1," variable == 10");
    local_13c1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_13c0);
    local_13c1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread((thread *)0x10c7a5);
  std::thread::~thread((thread *)0x10c7b2);
  poVar1 = std::operator<<((ostream *)&std::cout,"Test mutex");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  variable = 0;
  std::mutex::mutex((mutex *)0x10c804);
  local_13f8 = local_13f0;
  std::thread::thread<incrementer<std::mutex>&,,void>
            (in_stack_ffffffffffffc2a0,(incrementer<std::mutex> *)in_stack_ffffffffffffc298);
  std::thread::thread<incrementer<std::mutex>&,,void>
            (in_stack_ffffffffffffc2a0,(incrementer<std::mutex> *)in_stack_ffffffffffffc298);
  std::thread::join();
  std::thread::join();
  if (variable != 10) {
    std::__cxx11::ostringstream::ostringstream(local_1580);
    poVar1 = std::operator<<((ostream *)local_1580,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x105);
    std::operator<<(poVar1," variable == 10");
    local_15a1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_15a0);
    local_15a1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread((thread *)0x10ca53);
  std::thread::~thread((thread *)0x10ca60);
  poVar1 = std::operator<<((ostream *)&std::cout,"Test thread specific");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  booster::thread_specific_ptr<tls_object>::thread_specific_ptr
            ((thread_specific_ptr<tls_object> *)0x10caa0);
  tls_functor::tls_functor(&local_15b8,&local_15b0);
  tls_functor::tls_functor(&local_15c0,&local_15b0);
  tls_functor::tls_functor(&local_15c8,&local_15b0);
  std::thread::thread<tls_functor&,,void>
            (in_stack_ffffffffffffc2a0,(tls_functor *)in_stack_ffffffffffffc298);
  std::thread::thread<tls_functor&,,void>
            (in_stack_ffffffffffffc2a0,(tls_functor *)in_stack_ffffffffffffc298);
  std::thread::thread<tls_functor&,,void>
            (in_stack_ffffffffffffc2a0,(tls_functor *)in_stack_ffffffffffffc298);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  if ((tls_ok & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1758);
    poVar1 = std::operator<<((ostream *)local_1758,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x115);
    std::operator<<(poVar1," tls_ok");
    local_1779 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1778);
    local_1779 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (dtor_called != 3) {
    std::__cxx11::ostringstream::ostringstream(local_18f8);
    poVar1 = std::operator<<((ostream *)local_18f8,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x116);
    std::operator<<(poVar1," dtor_called == 3");
    local_1919 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1918);
    local_1919 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread((thread *)0x10cf17);
  std::thread::~thread((thread *)0x10cf24);
  std::thread::~thread((thread *)0x10cf31);
  booster::thread_specific_ptr<tls_object>::~thread_specific_ptr
            ((thread_specific_ptr<tls_object> *)0x10cf3e);
  poVar1 = std::operator<<((ostream *)&std::cout,"Non synchronous thread specific");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dtor_called = 0;
  ptVar2 = (thread_specific_ptr<tls_object> *)operator_new(8);
  booster::thread_specific_ptr<tls_object>::thread_specific_ptr
            ((thread_specific_ptr<tls_object> *)0x10cf9c);
  local_1928 = ptVar2;
  tls_functor2::tls_functor2(&local_1930,ptVar2);
  tls_functor2::tls_functor2(&local_1938,local_1928);
  tls_functor2::tls_functor2(&local_1940,local_1928);
  std::thread::thread<tls_functor2&,,void>
            (in_stack_ffffffffffffc2a0,(tls_functor2 *)in_stack_ffffffffffffc298);
  std::thread::thread<tls_functor2&,,void>
            (in_stack_ffffffffffffc2a0,(tls_functor2 *)in_stack_ffffffffffffc298);
  std::thread::thread<tls_functor2&,,void>
            (in_stack_ffffffffffffc2a0,(tls_functor2 *)in_stack_ffffffffffffc298);
  booster::ptime::millisleep(in_stack_ffffffffffffc280);
  ptVar2 = local_1928;
  if (local_1928 != (thread_specific_ptr<tls_object> *)0x0) {
    booster::thread_specific_ptr<tls_object>::~thread_specific_ptr
              ((thread_specific_ptr<tls_object> *)0x10d067);
    operator_delete(ptVar2);
  }
  std::thread::join();
  std::thread::join();
  std::thread::join();
  if (dtor_called != 3) {
    std::__cxx11::ostringstream::ostringstream(local_1ad0);
    poVar1 = std::operator<<((ostream *)local_1ad0,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,300);
    std::operator<<(poVar1," dtor_called == 3");
    local_1af1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1af0);
    local_1af1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread((thread *)0x10d2f1);
  std::thread::~thread((thread *)0x10d2fe);
  std::thread::~thread((thread *)0x10d30b);
  poVar1 = std::operator<<((ostream *)&std::cout,"Thest conditional variable notify one");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1af8 = 0;
  std::mutex::mutex((mutex *)0x10d35e);
  std::condition_variable::condition_variable(local_1b50);
  local_1b68 = &local_1af8;
  local_1b60 = local_1b20;
  local_1b58 = local_1b50;
  std::thread::thread<cond_incrementer&,,void>
            (in_stack_ffffffffffffc2a0,(cond_incrementer *)in_stack_ffffffffffffc298);
  std::thread::thread<cond_incrementer&,,void>
            (in_stack_ffffffffffffc2a0,(cond_incrementer *)in_stack_ffffffffffffc298);
  std::thread::thread<cond_incrementer&,,void>
            (in_stack_ffffffffffffc2a0,(cond_incrementer *)in_stack_ffffffffffffc298);
  booster::ptime::millisleep(in_stack_ffffffffffffc280);
  if (local_1af8 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1cf8);
    poVar1 = std::operator<<((ostream *)local_1cf8,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x138);
    std::operator<<(poVar1," counter == 0");
    local_1d19 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1d18);
    local_1d19 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::condition_variable::notify_one();
  booster::ptime::millisleep(in_stack_ffffffffffffc280);
  if (local_1af8 == 1) {
    std::condition_variable::notify_one();
    booster::ptime::millisleep(in_stack_ffffffffffffc280);
    if (local_1af8 != 2) {
      std::__cxx11::ostringstream::ostringstream(local_2038);
      poVar1 = std::operator<<((ostream *)local_2038,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x13e);
      std::operator<<(poVar1," counter == 2");
      local_2059 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2058);
      local_2059 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::condition_variable::notify_one();
    booster::ptime::millisleep(in_stack_ffffffffffffc280);
    if (local_1af8 != 3) {
      std::__cxx11::ostringstream::ostringstream(local_21d8);
      poVar1 = std::operator<<((ostream *)local_21d8,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x141);
      std::operator<<(poVar1," counter == 3");
      local_21f9 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_21f8);
      local_21f9 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::thread::join();
    std::thread::join();
    std::thread::join();
    std::thread::~thread((thread *)0x10db65);
    std::thread::~thread((thread *)0x10db72);
    std::thread::~thread((thread *)0x10db7f);
    std::condition_variable::~condition_variable(local_1b50);
    poVar1 = std::operator<<((ostream *)&std::cout,"Thest conditional variable notify all");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_2200 = 0;
    local_2208 = 0;
    std::mutex::mutex((mutex *)0x10dbeb);
    std::condition_variable::condition_variable(local_2260);
    local_2278 = &local_2208;
    local_2270 = local_2230;
    local_2268 = local_2260;
    std::thread::thread<cond_incrementer&,,void>
              (in_stack_ffffffffffffc2a0,(cond_incrementer *)in_stack_ffffffffffffc298);
    local_2278 = (undefined8 *)((long)local_2278 + 4);
    std::thread::thread<cond_incrementer&,,void>
              (in_stack_ffffffffffffc2a0,(cond_incrementer *)in_stack_ffffffffffffc298);
    local_2278 = (undefined8 *)((long)local_2278 + 4);
    std::thread::thread<cond_incrementer&,,void>
              (in_stack_ffffffffffffc2a0,(cond_incrementer *)in_stack_ffffffffffffc298);
    booster::ptime::millisleep(in_stack_ffffffffffffc280);
    if ((((int)local_2208 != 0) || (local_2208._4_4_ != 0)) || (local_2200 != 0)) {
      std::__cxx11::ostringstream::ostringstream(local_2408);
      poVar1 = std::operator<<((ostream *)local_2408,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x152);
      std::operator<<(poVar1," counter[0]==0 && counter[1]==0 && counter[2]==0");
      local_2429 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2428);
      local_2429 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::condition_variable::notify_all();
    booster::ptime::millisleep(in_stack_ffffffffffffc280);
    if ((((int)local_2208 != 1) || (local_2208._4_4_ != 1)) || (local_2200 != 1)) {
      std::__cxx11::ostringstream::ostringstream(local_25a8);
      poVar1 = std::operator<<((ostream *)local_25a8,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x155);
      std::operator<<(poVar1," counter[0]==1 && counter[1]==1 && counter[2]==1");
      local_25c9 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_25c8);
      local_25c9 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::thread::join();
    std::thread::join();
    std::thread::join();
    std::thread::~thread((thread *)0x10e0f9);
    std::thread::~thread((thread *)0x10e106);
    std::thread::~thread((thread *)0x10e113);
    std::condition_variable::~condition_variable(local_2260);
    poVar1 = std::operator<<((ostream *)&std::cout,"Test shared_mutex write lock");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    variable = 0;
    booster::shared_mutex::shared_mutex(local_25d8);
    local_25e0 = local_25d8;
    std::thread::thread<incrementer<booster::shared_mutex>&,,void>
              (in_stack_ffffffffffffc2a0,
               (incrementer<booster::shared_mutex> *)in_stack_ffffffffffffc298);
    std::thread::thread<incrementer<booster::shared_mutex>&,,void>
              (in_stack_ffffffffffffc2a0,
               (incrementer<booster::shared_mutex> *)in_stack_ffffffffffffc298);
    std::thread::join();
    std::thread::join();
    if (variable != 10) {
      std::__cxx11::ostringstream::ostringstream(local_2768);
      poVar1 = std::operator<<((ostream *)local_2768,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x163);
      std::operator<<(poVar1," variable == 10");
      local_2789 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2788);
      local_2789 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::thread::~thread((thread *)0x10e3f2);
    std::thread::~thread((thread *)0x10e3ff);
    booster::shared_mutex::~shared_mutex(local_25d8);
    poVar1 = std::operator<<((ostream *)&std::cout,"Test recursive_shared_mutex write lock");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    variable = 0;
    booster::shared_mutex::shared_mutex(local_2798);
    local_27a0 = local_2798;
    std::thread::thread<incrementer<booster::shared_mutex>&,,void>
              (in_stack_ffffffffffffc2a0,
               (incrementer<booster::shared_mutex> *)in_stack_ffffffffffffc298);
    std::thread::thread<incrementer<booster::shared_mutex>&,,void>
              (in_stack_ffffffffffffc2a0,
               (incrementer<booster::shared_mutex> *)in_stack_ffffffffffffc298);
    std::thread::join();
    std::thread::join();
    if (variable != 10) {
      std::__cxx11::ostringstream::ostringstream(local_2928);
      poVar1 = std::operator<<((ostream *)local_2928,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x16e);
      std::operator<<(poVar1," variable == 10");
      local_2949 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2948);
      local_2949 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::thread::~thread((thread *)0x10e6cd);
    std::thread::~thread((thread *)0x10e6da);
    booster::shared_mutex::~shared_mutex(local_2798);
    poVar1 = std::operator<<((ostream *)&std::cout,"Test shared_mutex shared/write lock");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::mutex::mutex((mutex *)0x10e727);
    booster::shared_mutex::shared_mutex(local_2980);
    local_2982[0] = 0;
    local_2984 = 0;
    local_29e8 = local_2982;
    local_2985 = 0;
    local_2986 = 0;
    local_2987 = 0;
    local_29a8 = &local_2984;
    local_29a0 = 1;
    local_29d8 = local_2978;
    local_29d0 = local_2980;
    local_29c8 = (long)&local_2984 + 1;
    local_29c0 = 1;
    local_29e0 = 1;
    local_29b8 = local_29d8;
    local_29b0 = local_29d0;
    local_2998 = local_29d8;
    local_2990 = local_29d0;
    std::thread::thread<rw_executor<booster::shared_mutex>&,,void>
              (in_stack_ffffffffffffc2a0,
               (rw_executor<booster::shared_mutex> *)in_stack_ffffffffffffc298);
    std::thread::thread<rw_executor<booster::shared_mutex>&,,void>
              (in_stack_ffffffffffffc2a0,
               (rw_executor<booster::shared_mutex> *)in_stack_ffffffffffffc298);
    std::thread::thread<rw_executor<booster::shared_mutex>&,,void>
              (in_stack_ffffffffffffc2a0,
               (rw_executor<booster::shared_mutex> *)in_stack_ffffffffffffc298);
    for (local_2a04 = 0; local_2a04 < 100; local_2a04 = local_2a04 + 1) {
      booster::ptime::millisleep(in_stack_ffffffffffffc280);
      std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffc270,in_stack_ffffffffffffc268)
      ;
      if (((local_2984 & 1) != 0) && ((local_2984 & 0x100) != 0)) {
        local_2985 = 1;
      }
      if ((local_2982[0] & 1) != 0) {
        local_2986 = 1;
      }
      if ((((local_2984 & 1) != 0) || ((local_2984 & 0x100) != 0)) && ((local_2982[0] & 1) != 0)) {
        local_2987 = 1;
      }
      std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffc270);
    }
    std::thread::join();
    std::thread::join();
    std::thread::join();
    if ((local_2985 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_2b90);
      poVar1 = std::operator<<((ostream *)local_2b90,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,400);
      std::operator<<(poVar1," mread_happened");
      local_2bb1 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2bb0);
      local_2bb1 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_2986 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_2d30);
      poVar1 = std::operator<<((ostream *)local_2d30,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x191);
      std::operator<<(poVar1," write_happened");
      local_2d51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2d50);
      local_2d51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_2987 & 1) != 0) {
      std::thread::~thread((thread *)0x10ee79);
      std::thread::~thread((thread *)0x10ee86);
      std::thread::~thread((thread *)0x10ee93);
      booster::shared_mutex::~shared_mutex(local_2980);
      poVar1 = std::operator<<((ostream *)&std::cout,"Test recursive_shared_mutex shared/write lock"
                              );
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::mutex::mutex((mutex *)0x10eee0);
      booster::recursive_shared_mutex::recursive_shared_mutex(local_2f28);
      local_2f2a[0] = 0;
      local_2f2c = 0;
      local_2f90 = local_2f2a;
      local_2f2d = 0;
      local_2f2e = 0;
      local_2f2f = 0;
      local_2f50 = &local_2f2c;
      local_2f48 = 1;
      local_2f80 = local_2f20;
      local_2f78 = local_2f28;
      local_2f70 = (long)&local_2f2c + 1;
      local_2f68 = 1;
      local_2f88 = 1;
      local_2f60 = local_2f80;
      local_2f58 = local_2f78;
      local_2f40 = local_2f80;
      local_2f38 = local_2f78;
      std::thread::thread<rw_executor<booster::recursive_shared_mutex>&,,void>
                (in_stack_ffffffffffffc2a0,in_stack_ffffffffffffc298);
      std::thread::thread<rw_executor<booster::recursive_shared_mutex>&,,void>
                (in_stack_ffffffffffffc2a0,in_stack_ffffffffffffc298);
      std::thread::thread<rw_executor<booster::recursive_shared_mutex>&,,void>
                (in_stack_ffffffffffffc2a0,in_stack_ffffffffffffc298);
      for (local_2fac = 0; local_2fac < 100; local_2fac = local_2fac + 1) {
        booster::ptime::millisleep(in_stack_ffffffffffffc280);
        std::unique_lock<std::mutex>::unique_lock
                  (in_stack_ffffffffffffc270,in_stack_ffffffffffffc268);
        if (((local_2f2c & 1) != 0) && ((local_2f2c & 0x100) != 0)) {
          local_2f2d = 1;
        }
        if ((local_2f2a[0] & 1) != 0) {
          local_2f2e = 1;
        }
        if ((((local_2f2c & 1) != 0) || ((local_2f2c & 0x100) != 0)) && ((local_2f2a[0] & 1) != 0))
        {
          local_2f2f = 1;
        }
        std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffc270);
      }
      std::thread::join();
      std::thread::join();
      std::thread::join();
      if ((local_2f2d & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_3138);
        poVar1 = std::operator<<((ostream *)local_3138,"Error ");
        poVar1 = std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                );
        poVar1 = std::operator<<(poVar1,":");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1b4);
        std::operator<<(poVar1," mread_happened");
        local_3159 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_3158);
        local_3159 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((local_2f2e & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_32d8);
        poVar1 = std::operator<<((ostream *)local_32d8,"Error ");
        poVar1 = std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                );
        poVar1 = std::operator<<(poVar1,":");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1b5);
        std::operator<<(poVar1," write_happened");
        local_32f9 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_32f8);
        local_32f9 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((local_2f2f & 1) != 0) {
        std::thread::~thread((thread *)0x10f627);
        std::thread::~thread((thread *)0x10f634);
        std::thread::~thread((thread *)0x10f641);
        booster::recursive_shared_mutex::~recursive_shared_mutex(local_2f28);
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 "Test recursive_shared_mutex recursive shared lock");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        booster::recursive_shared_mutex::recursive_shared_mutex(local_34a8);
        local_34a9 = 0;
        local_34aa = 0;
        local_34d0 = local_34a8;
        local_34b8 = &local_34a9;
        local_34c8 = &local_34aa;
        local_34c0 = local_34d0;
        std::thread::thread<rw_shared_thread&,,void>
                  (in_stack_ffffffffffffc2a0,(rw_shared_thread *)in_stack_ffffffffffffc298);
        std::thread::thread<rw_unique_thread&,,void>
                  (in_stack_ffffffffffffc2a0,(rw_unique_thread *)in_stack_ffffffffffffc298);
        std::thread::join();
        std::thread::join();
        if ((local_34a9 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream(local_3658);
          poVar1 = std::operator<<((ostream *)local_3658,"Error ");
          poVar1 = std::operator<<(poVar1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                  );
          poVar1 = std::operator<<(poVar1,":");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1c3);
          std::operator<<(poVar1," read");
          local_3679 = 1;
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::str();
          std::runtime_error::runtime_error(prVar3,local_3678);
          local_3679 = 0;
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((local_34aa & 1) != 0) {
          std::thread::~thread((thread *)0x10fa94);
          std::thread::~thread((thread *)0x10faa1);
          booster::recursive_shared_mutex::~recursive_shared_mutex(local_34a8);
          poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
          std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
          return 0;
        }
        std::__cxx11::ostringstream::ostringstream(local_37f8);
        poVar1 = std::operator<<((ostream *)local_37f8,"Error ");
        poVar1 = std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                );
        poVar1 = std::operator<<(poVar1,":");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1c4);
        std::operator<<(poVar1," write");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_3818);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream(local_3478);
      poVar1 = std::operator<<((ostream *)local_3478,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1b6);
      std::operator<<(poVar1," error_occured");
      local_3499 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_3498);
      local_3499 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream(local_2ed0);
    poVar1 = std::operator<<((ostream *)local_2ed0,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x192);
    std::operator<<(poVar1," error_occured");
    local_2ef1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2ef0);
    local_2ef1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_1e98);
  poVar1 = std::operator<<((ostream *)local_1e98,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x13b);
  std::operator<<(poVar1," counter == 1");
  local_1eb9 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar3,local_1eb8);
  local_1eb9 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		{
			std::cout << "Test execution" << std::endl;
			TEST(!called_);
			booster::thread t(caller);
			t.join();
			TEST(called_);
		}
		{
			std::cout << "Functor destruction" << std::endl;
			TEST(counted_functor::objects==0);
			{
				counted_functor f;
				booster::thread t(f);
				TEST(counted_functor::objects>=2);
				t.join();
				TEST(counted_functor::objects==1);
			}
			TEST(counted_functor::objects==0);
			{
				{
                    counted_functor f;
                    booster::thread t(f);
                    TEST(counted_functor::objects>=2);
                    t.detach();
                }
				TEST(counted_functor::objects>=1);
                booster::ptime::millisleep(400);
                TEST(counted_functor::objects==0);
			}
			
		}
		std::cout << "Test recursive mutex" << std::endl;
		{
			booster::recursive_mutex m;
			m.lock();
			m.lock();
			TEST("Double lock works");
			m.unlock();
			m.unlock();
			TEST("Got there");
		}
		{
			variable = 0;
			booster::recursive_mutex m;
			incrementer<booster::recursive_mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test mutex" << std::endl;
		{
			variable = 0;
			booster::mutex m;
			incrementer<booster::mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test thread specific" << std::endl;
		{
			booster::thread_specific_ptr<tls_object> p;
			tls_functor f1(p);
			tls_functor f2(p);
			tls_functor f3(p);
			booster::thread t1(f1);
			booster::thread t2(f2);
			booster::thread t3(f3);

			t1.join();
			t2.join();
			t3.join();

			TEST(tls_ok);
			TEST(dtor_called == 3);
		}
		std::cout << "Non synchronous thread specific" << std::endl;
		{
			dtor_called = 0;
			booster::thread_specific_ptr<tls_object> *p = new booster::thread_specific_ptr<tls_object>();
			
			tls_functor2 f1(*p);
			tls_functor2 f2(*p);
			tls_functor2 f3(*p);

			booster::thread t1(f1);
			booster::thread t2(f2);
			booster::thread t3(f3);

			booster::ptime::millisleep(300);
			delete p;
			
			t1.join();
			t2.join();
			t3.join();

			TEST(dtor_called == 3);
		}
		std::cout << "Thest conditional variable notify one" << std::endl;
		{
			int counter = 0;
			booster::mutex m;
			booster::condition_variable c;
			cond_incrementer inc = { &counter, &m , &c };
			booster::thread t1(inc);
			booster::thread t2(inc);
			booster::thread t3(inc);
			booster::ptime::millisleep(100);
			TEST(counter == 0);
			c.notify_one();
			booster::ptime::millisleep(100);
			TEST(counter == 1);
			c.notify_one();
			booster::ptime::millisleep(100);
			TEST(counter == 2);
			c.notify_one();
			booster::ptime::millisleep(100);
			TEST(counter == 3);
			t1.join();
			t2.join();
			t3.join();
		}
		std::cout << "Thest conditional variable notify all" << std::endl;
		{
			int counter[3] = { 0, 0 , 0 };
			booster::mutex m;
			booster::condition_variable c;
			cond_incrementer inc = { counter, &m , &c };
			booster::thread t1(inc);
			inc.counter++;
			booster::thread t2(inc);
			inc.counter++;
			booster::thread t3(inc);
			booster::ptime::millisleep(100);
			TEST(counter[0]==0 && counter[1]==0 && counter[2]==0);
			c.notify_all();
			booster::ptime::millisleep(100);
			TEST(counter[0]==1 && counter[1]==1 && counter[2]==1);
			t1.join();
			t2.join();
			t3.join();
		}
		std::cout << "Test shared_mutex write lock" << std::endl;
		{
			variable = 0;
			booster::shared_mutex m;
			incrementer<booster::shared_mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test recursive_shared_mutex write lock" << std::endl;
		{
			variable = 0;
			booster::shared_mutex m;
			incrementer<booster::shared_mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test shared_mutex shared/write lock" << std::endl;
		{
			booster::mutex fm;
			booster::shared_mutex sm;
			bool flags[3] = {false,false,false};
			bool mread_happened  = false;
			bool write_happened = false;
			bool error_occured = false ;
			rw_executor<booster::shared_mutex> exec1 = { flags + 0, true, &fm, &sm };
			rw_executor<booster::shared_mutex> exec2 = { flags + 1, true, &fm, &sm };
			rw_executor<booster::shared_mutex> exec3 = { flags + 2, true, &fm, &sm };
			booster::thread t1(exec1);
			booster::thread t2(exec2);
			booster::thread t3(exec3);

			for(int i=0;i<100;i++) {
				booster::ptime::millisleep(1);
				{
					booster::unique_lock<booster::mutex> l(fm);
					if(flags[0] && flags[1])
						mread_happened = true;
					if(flags[2])
						write_happened = true;
					if((flags[0] || flags[1]) && flags[2])
						error_occured = true;
				}
			}

			t1.join();
			t2.join();
			t3.join();

			TEST(mread_happened);
			TEST(write_happened);
			TEST(error_occured);
		}
		std::cout << "Test recursive_shared_mutex shared/write lock" << std::endl;
		{
			booster::mutex fm;
			booster::recursive_shared_mutex sm;
			bool flags[3] = {false,false,false};
			bool mread_happened  = false;
			bool write_happened = false;
			bool error_occured = false ;
			rw_executor<booster::recursive_shared_mutex> exec1 = { flags + 0, true, &fm, &sm };
			rw_executor<booster::recursive_shared_mutex> exec2 = { flags + 1, true, &fm, &sm };
			rw_executor<booster::recursive_shared_mutex> exec3 = { flags + 2, true, &fm, &sm };
			booster::thread t1(exec1);
			booster::thread t2(exec2);
			booster::thread t3(exec3);

			for(int i=0;i<100;i++) {
				booster::ptime::millisleep(1);
				{
					booster::unique_lock<booster::mutex> l(fm);
					if(flags[0] && flags[1])
						mread_happened = true;
					if(flags[2])
						write_happened = true;
					if((flags[0] || flags[1]) && flags[2])
						error_occured = true;
				}
			}

			t1.join();
			t2.join();
			t3.join();

			TEST(mread_happened);
			TEST(write_happened);
			TEST(error_occured);
		}
		std::cout << "Test recursive_shared_mutex recursive shared lock" << std::endl;
		{
			booster::recursive_shared_mutex l;
			bool read  = false;
			bool write = false;
			rw_shared_thread t1c = { &l, &read };
			rw_unique_thread t2c = { &l, &write };
			booster::thread t1(t1c);
			booster::thread t2(t2c);
			t1.join();
			t2.join();
			TEST(read);
			TEST(write);
		}

}
	catch(std::exception const &e)
	{
		std::cerr << "Fail:" <<e.what();
		return EXIT_FAILURE;
	}
	std::cout << "Ok" << std::endl;
	return EXIT_SUCCESS;
	
}